

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O3

ssize_t Curl_bufq_slurp(bufq *q,Curl_bufq_reader *reader,void *reader_ctx,CURLcode *err)

{
  buf_chunk *pbVar1;
  long lVar2;
  ssize_t sVar3;
  ssize_t sVar4;
  
  *err = CURLE_AGAIN;
  lVar2 = Curl_bufq_sipn(q,0,reader,reader_ctx,err);
  sVar4 = -1;
  if (-1 < lVar2) {
    sVar3 = 0;
    do {
      if (lVar2 == 0) goto LAB_00112c40;
      sVar3 = sVar3 + lVar2;
      pbVar1 = q->tail;
      if ((pbVar1 != (buf_chunk *)0x0) && (pbVar1->w_offset < pbVar1->dlen)) {
        return sVar3;
      }
      lVar2 = Curl_bufq_sipn(q,0,reader,reader_ctx,err);
    } while (-1 < lVar2);
    if ((sVar3 != 0) && (*err == CURLE_AGAIN)) {
LAB_00112c40:
      *err = CURLE_OK;
      sVar4 = sVar3;
    }
  }
  return sVar4;
}

Assistant:

ssize_t Curl_bufq_slurp(struct bufq *q, Curl_bufq_reader *reader,
                        void *reader_ctx, CURLcode *err)
{
  return bufq_slurpn(q, 0, reader, reader_ctx, err);
}